

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O1

axbStatus_t axbMatSetValuesDense(axbMat_s *mat,void *values,axbDataType_t values_datatype)

{
  axbStatus_t aVar1;
  uint uVar2;
  uint extraout_EAX;
  axbDataType_t dest_type;
  void *ptr;
  ulong uVar3;
  
  if (mat->init != 0x1d233) {
    fprintf(_stderr,"ERROR in %s: Matrix not yet initialized. Call to axbMatCreateEnd() required.\n"
            ,"axbMatSetValuesDense");
    return mat->init;
  }
  if (mat->storage_type == AXB_STORAGE_DENSE) {
LAB_00107700:
    aVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->values,
                                mat->values_datatype,mat->cols * mat->rows);
    ptr = values;
    if (aVar1 == 0) {
      return 0;
    }
LAB_00107755:
    axbMatSetValuesDense_cold_1();
LAB_0010775c:
    axbMatSetValuesDense_cold_3();
LAB_00107763:
    axbMatSetValuesDense_cold_4();
LAB_0010776a:
    axbMatSetValuesDense_cold_5();
LAB_00107771:
    axbMatSetValuesDense_cold_6();
LAB_00107778:
    axbMatSetValuesDense_cold_7();
  }
  else {
    if (mat->storage_type != AXB_STORAGE_CSR) {
      return 1;
    }
    ptr = mat->row_markers;
    aVar1 = axbMemBackendFree(mat->memBackend,ptr);
    if (aVar1 != 0) {
      axbMatSetValuesDense_cold_2();
      goto LAB_00107755;
    }
    ptr = mat->col_indices;
    aVar1 = axbMemBackendFree(mat->memBackend,ptr);
    if (aVar1 != 0) goto LAB_0010775c;
    ptr = mat->values;
    aVar1 = axbMemBackendFree(mat->memBackend,ptr);
    if (aVar1 != 0) goto LAB_00107763;
    ptr = (void *)(mat->rows * 4 + 4);
    aVar1 = axbMemBackendMalloc(mat->memBackend,(size_t)ptr,&mat->row_markers);
    if (aVar1 != 0) goto LAB_0010776a;
    ptr = (void *)(mat->rows * mat->cols * 4);
    aVar1 = axbMemBackendMalloc(mat->memBackend,(size_t)ptr,&mat->col_indices);
    if (aVar1 != 0) goto LAB_00107771;
    ptr = (void *)(mat->rows * mat->cols * 8);
    aVar1 = axbMemBackendMalloc(mat->memBackend,(size_t)ptr,&mat->values);
    if (aVar1 != 0) goto LAB_00107778;
    ptr = values;
    aVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->row_markers,
                                mat->row_markers_datatype,mat->rows + 1);
    if (aVar1 == 0) {
      ptr = values;
      uVar2 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->col_indices,
                                  mat->col_indices_datatype,mat->cols * mat->rows);
      if (uVar2 != 0) goto LAB_00107786;
      aVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->values,
                                  mat->values_datatype,mat->cols * mat->rows);
      if (aVar1 == 0) {
        return 0;
      }
      axbMatSetValuesDense_cold_10();
      goto LAB_00107700;
    }
  }
  axbMatSetValuesDense_cold_8();
  uVar2 = extraout_EAX;
LAB_00107786:
  uVar3 = (ulong)uVar2;
  axbMatSetValuesDense_cold_9();
  if (*(int *)(uVar3 + 100) == 2) {
    aVar1 = axbMemBackendCopyOut
                      (*(axbMemBackend_s **)(uVar3 + 0x68),*(void **)(uVar3 + 0x58),
                       *(axbDataType_t *)(uVar3 + 0x60),ptr,dest_type,
                       *(long *)(uVar3 + 0x18) * *(long *)(uVar3 + 0x10));
    return aVar1;
  }
  return 1;
}

Assistant:

axbStatus_t axbMatSetValuesDense(struct axbMat_s *mat, void *values, axbDataType_t values_datatype)
{
  if (mat->init != 119347) {
    fprintf(stderr, "ERROR in %s: Matrix not yet initialized. Call to axbMatCreateEnd() required.\n", __func__);
    return mat->init;
  }

  axbStatus_t status;
  if (mat->storage_type == AXB_STORAGE_CSR) {

    status = axbMemBackendFree(mat->memBackend, mat->row_markers); AXB_ERRCHK(status);
    status = axbMemBackendFree(mat->memBackend, mat->col_indices); AXB_ERRCHK(status);
    status = axbMemBackendFree(mat->memBackend, mat->values); AXB_ERRCHK(status);

    status = axbMemBackendMalloc(mat->memBackend, sizeof(int)    * (mat->rows+1),           &(mat->row_markers)); AXB_ERRCHK(status);
    status = axbMemBackendMalloc(mat->memBackend, sizeof(int)    * (mat->rows * mat->cols), &(mat->col_indices)); AXB_ERRCHK(status);
    status = axbMemBackendMalloc(mat->memBackend, sizeof(double) * (mat->rows * mat->cols), &(mat->values)); AXB_ERRCHK(status);

    // create temporary array for rows and columns:
    int *tmp_rows = malloc(sizeof(int)    * (mat->rows+1));
    int *tmp_cols = malloc(sizeof(int)    * (mat->rows * mat->cols));

    tmp_rows[0] = 0;
    int index = 0;
    for (int i=0; i<(int)mat->rows; ++i) {
      for (int j=0; j<(int)mat->cols; ++j) {
        tmp_cols[index++] = j;
      }
      tmp_rows[i+1] = index;
    }

    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->row_markers, mat->row_markers_datatype, mat->rows + 1); AXB_ERRCHK(status);
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->col_indices, mat->col_indices_datatype, mat->rows * mat->cols); AXB_ERRCHK(status);
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->values,      mat->values_datatype,      mat->rows * mat->cols); AXB_ERRCHK(status);

    free(tmp_rows);
    free(tmp_cols);
  }
  else if (mat->storage_type == AXB_STORAGE_DENSE)
  {
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->values, mat->values_datatype, mat->rows * mat->cols); AXB_ERRCHK(status);
  } else {
    // TODO: implement
    return 1;
  }

  return 0;
}